

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O1

shared_ptr<helics::BrokerFactory::BrokerBuilder> *
helics::BrokerFactory::MasterBrokerBuilder::getDefaultBuilder(void)

{
  int iVar1;
  element_type *peVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer ptVar5;
  shared_ptr<helics::BrokerFactory::MasterBrokerBuilder> *psVar6;
  shared_ptr<helics::BrokerFactory::MasterBrokerBuilder> *psVar7;
  pointer ptVar8;
  HelicsException *this;
  bool bVar9;
  string_view message;
  
  psVar6 = instance();
  psVar7 = instance();
  peVar2 = (psVar7->
           super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  ptVar3 = (peVar2->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar4 = (peVar2->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = ptVar3 == ptVar4;
  ptVar8 = ptVar3;
  if (!bVar9) {
    iVar1 = (ptVar3->
            super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>
            ).super__Head_base<0UL,_int,_false>._M_head_impl;
    ptVar5 = ptVar3;
    while (ptVar8 = ptVar5, 10 < iVar1) {
      bVar9 = ptVar5 + 1 == ptVar4;
      ptVar8 = ptVar3;
      if (bVar9) break;
      iVar1 = ptVar5[1].
              super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>
              .super__Head_base<0UL,_int,_false>._M_head_impl;
      ptVar5 = ptVar5 + 1;
    }
  }
  if ((bVar9) &&
     (peVar2 = (psVar6->
               super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,
     ptVar8 = (peVar2->builders).
              super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
     ptVar8 == (peVar2->builders).
               super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
    this = (HelicsException *)__cxa_allocate_exception(0x28);
    message._M_str = "core type is not available";
    message._M_len = 0x1a;
    HelicsException::HelicsException(this,message);
    __cxa_throw(this,&HelicsException::typeinfo,HelicsException::~HelicsException);
  }
  return (shared_ptr<helics::BrokerFactory::BrokerBuilder> *)ptVar8;
}

Assistant:

static const std::shared_ptr<BrokerBuilder>& getDefaultBuilder()
    {
        const auto& blder = instance();
        for (auto& builder : instance()->builders) {
            if (std::get<0>(builder) <= 10) {
                return std::get<2>(builder);
            }
        }
        if (blder->builders.empty()) {
            throw(HelicsException("core type is not available"));
        }
        return std::get<2>(blder->builders[0]);
    }